

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  TargetType TVar1;
  pointer pcVar2;
  size_type sVar3;
  cmGlobalGenerator *pcVar4;
  cmMakefile *pcVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  string *in_base;
  char *pcVar9;
  _Alloc_hider __s;
  _Alloc_hider __s_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string suffix;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_108 [16];
  string conf;
  string configPropStr;
  string targetTypeName;
  string propertyNameStr;
  string configUpper;
  cmListFileBacktrace local_58;
  cmListFileBacktrace local_48;
  
  conf._M_dataplus._M_p = (pointer)&conf.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&conf,pcVar2,pcVar2 + config->_M_string_length);
  pcVar7 = GetOutputTargetType(this,artifact);
  targetTypeName._M_dataplus._M_p = (pointer)&targetTypeName.field_2;
  sVar8 = strlen(pcVar7);
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetTypeName,pcVar7,pcVar7 + sVar8);
  propertyNameStr._M_dataplus._M_p = (pointer)&propertyNameStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&propertyNameStr,targetTypeName._M_dataplus._M_p,
             targetTypeName._M_dataplus._M_p + targetTypeName._M_string_length);
  if (propertyNameStr._M_string_length == 0) {
    __s_00._M_p = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&propertyNameStr);
    __s_00 = propertyNameStr._M_dataplus;
  }
  cmsys::SystemTools::UpperCase(&configUpper,&conf);
  configPropStr._M_dataplus._M_p = (pointer)&configPropStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&configPropStr,targetTypeName._M_dataplus._M_p,
             targetTypeName._M_dataplus._M_p + targetTypeName._M_string_length);
  if (configPropStr._M_string_length == 0) {
    __s._M_p = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&configPropStr);
    std::__cxx11::string::_M_append((char *)&configPropStr,(ulong)configUpper._M_dataplus._M_p);
    __s = configPropStr._M_dataplus;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&suffix,__s._M_p,(allocator<char> *)&ge);
  pcVar7 = GetProperty(this,&suffix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suffix._M_dataplus._M_p != &suffix.field_2) {
    operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
  }
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&suffix,__s_00._M_p,(allocator<char> *)&ge);
    pcVar7 = GetProperty(this,&suffix);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
    if (pcVar7 == (char *)0x0) {
      TVar1 = this->Target->TargetTypeValue;
      if (TVar1 - STATIC_LIBRARY < 3) {
        pcVar5 = this->Makefile;
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        ge.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x13;
        suffix._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&suffix,(ulong)&ge);
        suffix.field_2._M_allocated_capacity =
             (size_type)
             ge.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        builtin_strncpy(suffix._M_dataplus._M_p,"LIBRARY_OUTPUT_PATH",0x13);
        suffix._M_string_length =
             (size_type)
             ge.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        suffix._M_dataplus._M_p
        [(long)ge.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr] = '\0';
        cmMakefile::GetSafeDefinition(pcVar5,&suffix);
        std::__cxx11::string::_M_assign((string *)out);
      }
      else {
        if (TVar1 != EXECUTABLE) goto LAB_002cb03d;
        pcVar5 = this->Makefile;
        ge.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x16;
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        suffix._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&suffix,(ulong)&ge);
        suffix.field_2._M_allocated_capacity =
             (size_type)
             ge.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        builtin_strncpy(suffix._M_dataplus._M_p,"EXECUTABLE_OUTPUT_PATH",0x16);
        suffix._M_string_length =
             (size_type)
             ge.Backtrace.TopEntry.
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        suffix._M_dataplus._M_p
        [(long)ge.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr] = '\0';
        cmMakefile::GetSafeDefinition(pcVar5,&suffix);
        std::__cxx11::string::_M_assign((string *)out);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)suffix._M_dataplus._M_p != &suffix.field_2) {
        operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002cb03d;
    }
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_58);
    if (local_58.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
    suffix._M_string_length = 0;
    suffix.field_2._M_allocated_capacity = suffix.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
               this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&suffix);
    std::__cxx11::string::_M_assign((string *)out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
    iVar6 = std::__cxx11::string::compare((char *)out);
    if (iVar6 != 0) {
      conf._M_string_length = 0;
      *conf._M_dataplus._M_p = '\0';
    }
  }
  else {
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_48);
    if (local_48.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
    suffix._M_string_length = 0;
    suffix.field_2._M_allocated_capacity = suffix.field_2._M_allocated_capacity & 0xffffffffffffff00
    ;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
               this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&suffix);
    std::__cxx11::string::_M_assign((string *)out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
    conf._M_string_length = 0;
    *conf._M_dataplus._M_p = '\0';
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
LAB_002cb03d:
  paVar10 = &suffix.field_2;
  sVar3 = out->_M_string_length;
  if (sVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)0x0,0x4b6d1b);
  }
  in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath(&suffix,out,in_base);
  std::__cxx11::string::operator=((string *)out,(string *)&suffix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suffix._M_dataplus._M_p != paVar10) {
    operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
  }
  if (conf._M_string_length != 0) {
    iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])
                      (this->GlobalGenerator,this->Makefile);
    pcVar7 = "";
    if ((sVar3 == 0 & (byte)iVar6) != 0) {
      pcVar7 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    pcVar9 = pcVar7 + 0x1a;
    if ((sVar3 == 0 & (byte)iVar6) == 0) {
      pcVar9 = pcVar7;
    }
    suffix._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&suffix,pcVar7,pcVar9);
    pcVar4 = this->LocalGenerator->GlobalGenerator;
    local_108._0_2_ = 0x2f;
    ge.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    ge.Backtrace.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_108;
    (*pcVar4->_vptr_cmGlobalGenerator[0x16])(pcVar4,&ge,&conf,&suffix,out);
    if (ge.Backtrace.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_108) {
      operator_delete(ge.Backtrace.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,CONCAT62(local_108._2_6_,local_108._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != paVar10) {
      operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configPropStr._M_dataplus._M_p != &configPropStr.field_2) {
    operator_delete(configPropStr._M_dataplus._M_p,configPropStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
    operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propertyNameStr._M_dataplus._M_p != &propertyNameStr.field_2) {
    operator_delete(propertyNameStr._M_dataplus._M_p,
                    propertyNameStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetTypeName._M_dataplus._M_p != &targetTypeName.field_2) {
    operator_delete(targetTypeName._M_dataplus._M_p,targetTypeName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)conf._M_dataplus._M_p != &conf.field_2) {
    operator_delete(conf._M_dataplus._M_p,conf.field_2._M_allocated_capacity + 1);
  }
  return sVar3 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  const char* propertyName = nullptr;
  std::string propertyNameStr = targetTypeName;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = nullptr;
  std::string configPropStr = targetTypeName;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf.clear();
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}